

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::castable(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  shared_ptr<Cast> local_88;
  undefined4 local_74;
  shared_ptr<Cast> local_70;
  undefined4 local_5c;
  shared_ptr<Cast> local_58;
  undefined4 local_44;
  shared_ptr<Cast> local_40 [2];
  undefined1 local_19;
  Parser *this_local;
  ptr<Expression> *expr;
  
  local_19 = 0;
  this_local = this;
  unary(this);
  bVar1 = match(in_RSI,As);
  _Var2._M_pi = extraout_RDX;
  if (bVar1) {
    consume(in_RSI);
    bVar1 = match(in_RSI,StringType);
    if (bVar1) {
      consume(in_RSI);
      local_44 = 1;
      make<Cast,std::shared_ptr<Expression>&,Type>((shared_ptr<Expression> *)local_40,(Type *)this);
      std::shared_ptr<Expression>::operator=((shared_ptr<Expression> *)this,local_40);
      std::shared_ptr<Cast>::~shared_ptr(local_40);
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      bVar1 = match(in_RSI,DoubleType);
      if (bVar1) {
        consume(in_RSI);
        local_5c = 2;
        make<Cast,std::shared_ptr<Expression>&,Type>
                  ((shared_ptr<Expression> *)&local_58,(Type *)this);
        std::shared_ptr<Expression>::operator=((shared_ptr<Expression> *)this,&local_58);
        std::shared_ptr<Cast>::~shared_ptr(&local_58);
        _Var2._M_pi = extraout_RDX_01;
      }
      else {
        bVar1 = match(in_RSI,IntegerType);
        if (bVar1) {
          consume(in_RSI);
          local_74 = 3;
          make<Cast,std::shared_ptr<Expression>&,Type>
                    ((shared_ptr<Expression> *)&local_70,(Type *)this);
          std::shared_ptr<Expression>::operator=((shared_ptr<Expression> *)this,&local_70);
          std::shared_ptr<Cast>::~shared_ptr(&local_70);
          _Var2._M_pi = extraout_RDX_02;
        }
        else {
          bVar1 = match(in_RSI,BooleanType);
          if (bVar1) {
            consume(in_RSI);
            make<Cast,std::shared_ptr<Expression>&,Type>
                      ((shared_ptr<Expression> *)&local_88,(Type *)this);
            std::shared_ptr<Expression>::operator=((shared_ptr<Expression> *)this,&local_88);
            std::shared_ptr<Cast>::~shared_ptr(&local_88);
            _Var2._M_pi = extraout_RDX_03;
          }
          else {
            unexpected(in_RSI);
            _Var2._M_pi = extraout_RDX_04;
          }
        }
      }
    }
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::castable() {
    ptr<Expression> expr = unary();

    if(match(TokenType::As)) {
        consume();

        if(match(TokenType::StringType)) {
            consume();
            expr = make<Cast>(expr, Type::String);
        } else if(match(TokenType::DoubleType)) {
            consume();
            expr = make<Cast>(expr, Type::Double);
        } else if(match(TokenType::IntegerType)) {
            consume();
            expr = make<Cast>(expr, Type::Integer);
        } else if(match(TokenType::BooleanType)) {
            consume();
            expr = make<Cast>(expr, Type::Boolean);
        } else {
            unexpected();
        }
    }

    return expr;
}